

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vpdi(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  TCGv_i64 dst;
  TCGv_i64 dst_00;
  TCGv_i64 t1;
  TCGv_i64 t0;
  uint8_t i3;
  uint8_t i2;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = get_field1(s,FLD_O_m4,FLD_C_b4);
  uVar1 = extract32(uVar1,2,1);
  uVar2 = get_field1(s,FLD_O_m4,FLD_C_b4);
  uVar2 = extract32(uVar2,0,1);
  dst = tcg_temp_new_i64(tcg_ctx_00);
  dst_00 = tcg_temp_new_i64(tcg_ctx_00);
  iVar3 = get_field1(s,FLD_O_v2,FLD_C_d4);
  read_vec_element_i64(tcg_ctx_00,dst,(uint8_t)iVar3,(uint8_t)uVar1,MO_64);
  iVar3 = get_field1(s,FLD_O_v3,FLD_C_i3);
  read_vec_element_i64(tcg_ctx_00,dst_00,(uint8_t)iVar3,(uint8_t)uVar2,MO_64);
  iVar3 = get_field1(s,FLD_O_v1,FLD_C_b1);
  write_vec_element_i64(tcg_ctx_00,dst,iVar3,'\0',MO_64);
  iVar3 = get_field1(s,FLD_O_v1,FLD_C_b1);
  write_vec_element_i64(tcg_ctx_00,dst_00,iVar3,'\x01',MO_64);
  tcg_temp_free_i64(tcg_ctx_00,dst);
  tcg_temp_free_i64(tcg_ctx_00,dst_00);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_vpdi(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t i2 = extract32(get_field(s, m4), 2, 1);
    const uint8_t i3 = extract32(get_field(s, m4), 0, 1);
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

    read_vec_element_i64(tcg_ctx, t0, get_field(s, v2), i2, ES_64);
    read_vec_element_i64(tcg_ctx, t1, get_field(s, v3), i3, ES_64);
    write_vec_element_i64(tcg_ctx, t0, get_field(s, v1), 0, ES_64);
    write_vec_element_i64(tcg_ctx, t1, get_field(s, v1), 1, ES_64);
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    return DISAS_NEXT;
}